

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O2

void sysbvm_identityDictionary_atPut
               (sysbvm_context_t *context,sysbvm_tuple_t dictionary,sysbvm_tuple_t key,
               sysbvm_tuple_t value)

{
  ulong uVar1;
  sysbvm_tuple_t sVar2;
  long lVar3;
  ulong uVar4;
  long lStack_40;
  
  if ((dictionary & 0xf) == 0 && dictionary != 0) {
    lStack_40 = sysbvm_identityDictionary_scanFor(dictionary,key);
    if (lStack_40 < 0) {
      sysbvm_identityDictionary_increaseCapacity(context,dictionary);
      lStack_40 = sysbvm_identityDictionary_scanFor(dictionary,key);
      if (lStack_40 < 0) {
        sysbvm_error("Dictionary out of memory.");
        lStack_40 = -1;
      }
    }
    lVar3 = *(long *)(dictionary + 0x18);
    uVar4 = *(ulong *)(lVar3 + 0x10 + lStack_40 * 8);
    if (uVar4 == 0) {
      sVar2 = sysbvm_association_create(context,key,value);
      *(sysbvm_tuple_t *)(lVar3 + 0x10 + lStack_40 * 8) = sVar2;
      uVar4 = *(ulong *)(dictionary + 0x18);
      if ((uVar4 & 0xf) == 0 && uVar4 != 0) {
        uVar4 = (ulong)(*(uint *)(uVar4 + 0xc) >> 1 & 0xfffffffc) / 5;
      }
      else {
        uVar4 = 0;
      }
      uVar1 = *(ulong *)(dictionary + 0x10);
      if (uVar1 == 0 || (uVar1 & 0xf) != 0) {
        lVar3 = (long)uVar1 >> 4;
      }
      else {
        lVar3 = *(long *)(uVar1 + 0x10);
      }
      sVar2 = sysbvm_tuple_size_encode(context,lVar3 + 1U);
      *(sysbvm_tuple_t *)(dictionary + 0x10) = sVar2;
      if (uVar4 <= lVar3 + 1U) {
        sysbvm_identityDictionary_increaseCapacity(context,dictionary);
        return;
      }
    }
    else if (((uVar4 & 0xf) == 0) && (0xf < *(uint *)(uVar4 + 0xc))) {
      *(sysbvm_tuple_t *)(uVar4 + 0x18) = value;
    }
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_identityDictionary_atPut(sysbvm_context_t *context, sysbvm_tuple_t dictionary, sysbvm_tuple_t key, sysbvm_tuple_t value)
{
    if(!sysbvm_tuple_isNonNullPointer(dictionary))
        return;

    intptr_t elementIndex = sysbvm_identityDictionary_scanFor(dictionary, key);
    if(elementIndex < 0)
    {
        sysbvm_identityDictionary_increaseCapacity(context, dictionary);
        elementIndex = sysbvm_identityDictionary_scanFor(dictionary, key);
        if(elementIndex < 0)
           sysbvm_error("Dictionary out of memory.");
    }

    sysbvm_dictionary_t *dictionaryObject = (sysbvm_dictionary_t*)dictionary;
    sysbvm_array_t *storage = (sysbvm_array_t*)dictionaryObject->storage;
    if(storage->elements[elementIndex])
    {
        sysbvm_association_setValue(storage->elements[elementIndex], value);
    }
    else
    {
        storage->elements[elementIndex] = sysbvm_association_create(context, key, value);
        size_t capacity = sysbvm_tuple_getSizeInSlots(dictionaryObject->storage);
        size_t newSize = sysbvm_tuple_size_decode(dictionaryObject->size) + 1;
        dictionaryObject->size = sysbvm_tuple_size_encode(context, newSize);
        size_t capacityThreshold = capacity * 4 / 5;

        // Make sure the maximum occupancy rate is not greater than 80%.
        if(newSize >= capacityThreshold)
            sysbvm_identityDictionary_increaseCapacity(context, dictionary);
    }
}